

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O3

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructBody
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,char *nameprefix,
          size_t index,bool in_array)

{
  BaseType BVar1;
  FieldDef *field;
  StructDef *pSVar2;
  pointer pcVar3;
  EnumDef *pEVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaVar5;
  char *pcVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long *plVar9;
  size_type *psVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  undefined7 in_register_00000089;
  unsigned_long t;
  ulong uVar14;
  pointer ppFVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string indent;
  string local_158;
  Type local_138;
  string local_110;
  string local_f0;
  uint local_cc;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  CSharpGenerator *local_88;
  Value *local_80;
  StructDef *local_78;
  size_t local_70;
  char *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_t local_40;
  pointer local_38;
  
  local_cc = (uint)CONCAT71(in_register_00000089,in_array);
  local_a8 = local_98;
  local_88 = this;
  local_78 = struct_def;
  local_70 = index;
  local_68 = nameprefix;
  std::__cxx11::string::_M_construct((ulong)&local_a8,(char)index * '\x02' + '\x02');
  ppaVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             **)&local_138.enum_def;
  local_138._0_8_ = ppaVar5;
  std::__cxx11::string::_M_construct<char*>((string *)&local_138,local_a8,local_a0 + (long)local_a8)
  ;
  std::__cxx11::string::append((char *)&local_138);
  std::__cxx11::string::_M_append((char *)code_ptr,local_138._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       **)local_138._0_8_ != ppaVar5) {
    operator_delete((void *)local_138._0_8_,
                    CONCAT62(local_138.enum_def._2_6_,local_138.enum_def._0_2_) + 1);
  }
  NumToString<unsigned_long>(&local_110,local_78->minalign);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
  plVar9 = plVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar9) {
    local_138.enum_def._0_2_ = (undefined2)*plVar9;
    local_138.enum_def._2_6_ = (undefined6)((ulong)*plVar9 >> 0x10);
    local_138.fixed_length = (uint16_t)plVar7[3];
    local_138._26_6_ = SUB86((ulong)plVar7[3] >> 0x10,0);
    local_138._0_8_ = ppaVar5;
  }
  else {
    local_138.enum_def._0_2_ = (undefined2)*plVar9;
    local_138.enum_def._2_6_ = (undefined6)((ulong)*plVar9 >> 0x10);
    local_138._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar7;
  }
  local_138.struct_def._0_2_ = (undefined2)plVar7[1];
  local_138.struct_def._2_6_ = (undefined6)((ulong)plVar7[1] >> 0x10);
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,local_138._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       **)local_138._0_8_ != ppaVar5) {
    operator_delete((void *)local_138._0_8_,
                    CONCAT62(local_138.enum_def._2_6_,local_138.enum_def._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  NumToString<unsigned_long>(&local_110,local_78->bytesize);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
  plVar9 = plVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar9) {
    local_138.enum_def._0_2_ = (undefined2)*plVar9;
    local_138.enum_def._2_6_ = (undefined6)((ulong)*plVar9 >> 0x10);
    local_138.fixed_length = (uint16_t)plVar7[3];
    local_138._26_6_ = SUB86((ulong)plVar7[3] >> 0x10,0);
    local_138._0_8_ = ppaVar5;
  }
  else {
    local_138.enum_def._0_2_ = (undefined2)*plVar9;
    local_138.enum_def._2_6_ = (undefined6)((ulong)*plVar9 >> 0x10);
    local_138._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar7;
  }
  local_138.struct_def._0_2_ = (undefined2)plVar7[1];
  local_138.struct_def._2_6_ = (undefined6)((ulong)plVar7[1] >> 0x10);
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,local_138._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       **)local_138._0_8_ != ppaVar5) {
    operator_delete((void *)local_138._0_8_,
                    CONCAT62(local_138.enum_def._2_6_,local_138.enum_def._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  ppFVar15 = (local_78->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar15 !=
      (local_78->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_40 = local_70 + 1;
    do {
      paVar11 = &local_f0.field_2;
      field = ppFVar15[-1];
      if (field->padding != 0) {
        local_138._0_8_ = &local_138.enum_def;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,local_a8,local_a0 + (long)local_a8);
        std::__cxx11::string::append((char *)&local_138);
        std::__cxx11::string::_M_append((char *)code_ptr,local_138._0_8_);
        if ((EnumDef **)local_138._0_8_ != &local_138.enum_def) {
          operator_delete((void *)local_138._0_8_,
                          CONCAT62(local_138.enum_def._2_6_,local_138.enum_def._0_2_) + 1);
        }
        NumToString<unsigned_long>(&local_110,field->padding);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_138._0_8_ = &local_138.enum_def;
        plVar9 = plVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar9) {
          local_138.enum_def._0_2_ = (undefined2)*plVar9;
          local_138.enum_def._2_6_ = (undefined6)((ulong)*plVar9 >> 0x10);
          local_138.fixed_length = (uint16_t)plVar7[3];
          local_138._26_6_ = SUB86((ulong)plVar7[3] >> 0x10,0);
        }
        else {
          local_138.enum_def._0_2_ = (undefined2)*plVar9;
          local_138.enum_def._2_6_ = (undefined6)((ulong)*plVar9 >> 0x10);
          local_138._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar7;
        }
        local_138.struct_def._0_2_ = (undefined2)plVar7[1];
        local_138.struct_def._2_6_ = (undefined6)((ulong)plVar7[1] >> 0x10);
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,local_138._0_8_);
        if ((EnumDef **)local_138._0_8_ != &local_138.enum_def) {
          operator_delete((void *)local_138._0_8_,
                          CONCAT62(local_138.enum_def._2_6_,local_138.enum_def._0_2_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
      }
      local_80 = &field->value;
      BVar1 = (local_80->type).base_type;
      local_38 = ppFVar15;
      if (BVar1 == BASE_TYPE_STRUCT) {
        pSVar2 = (field->value).type.struct_def;
        if (pSVar2->fixed == false) {
LAB_001b1751:
          local_138._0_8_ = *(undefined8 *)&local_80->type;
          pSVar2 = (field->value).type.struct_def;
          uVar12 = *(undefined8 *)((long)&(field->value).type.enum_def + 2);
          local_138.enum_def._0_2_ =
               (undefined2)
               ((ulong)*(undefined8 *)((long)&(field->value).type.struct_def + 2) >> 0x30);
          local_138.enum_def._2_6_ = (undefined6)uVar12;
          local_138.fixed_length = (uint16_t)((ulong)uVar12 >> 0x30);
          local_138.struct_def._0_2_ = SUB82(pSVar2,0);
          local_138.struct_def._2_6_ = (undefined6)((ulong)pSVar2 >> 0x10);
          goto LAB_001b176a;
        }
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        pcVar3 = (field->super_Definition).name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar3,
                   pcVar3 + (field->super_Definition).name._M_string_length);
        std::__cxx11::string::append((char *)&local_110);
        pcVar6 = local_68;
        strlen(local_68);
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_110,0,(char *)0x0,(ulong)pcVar6);
        local_138._0_8_ = &local_138.enum_def;
        plVar9 = plVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar9) {
          local_138.enum_def._0_2_ = (undefined2)*plVar9;
          local_138.enum_def._2_6_ = (undefined6)((ulong)*plVar9 >> 0x10);
          local_138.fixed_length = (uint16_t)plVar7[3];
          local_138._26_6_ = SUB86((ulong)plVar7[3] >> 0x10,0);
        }
        else {
          local_138.enum_def._0_2_ = (undefined2)*plVar9;
          local_138.enum_def._2_6_ = (undefined6)((ulong)*plVar9 >> 0x10);
          local_138._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar7;
        }
        local_138.struct_def._0_2_ = (undefined2)plVar7[1];
        local_138.struct_def._2_6_ = (undefined6)((ulong)plVar7[1] >> 0x10);
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        GenStructBody(local_88,pSVar2,code_ptr,(char *)local_138._0_8_,local_70,
                      (bool)((byte)local_cc & 1));
        if ((EnumDef **)local_138._0_8_ != &local_138.enum_def) {
          uVar12 = CONCAT62(local_138.enum_def._2_6_,local_138.enum_def._0_2_);
          _Var13._M_p = (pointer)local_138._0_8_;
LAB_001b20ca:
          operator_delete(_Var13._M_p,uVar12 + 1);
        }
      }
      else {
        if (BVar1 != BASE_TYPE_ARRAY) goto LAB_001b1751;
        local_138.fixed_length = (field->value).type.fixed_length;
        local_138.element = BASE_TYPE_NONE;
        local_138.base_type = (field->value).type.element;
        pSVar2 = (field->value).type.struct_def;
        pEVar4 = (field->value).type.enum_def;
        local_138.struct_def._0_2_ = SUB82(pSVar2,0);
        local_138.struct_def._2_6_ = (undefined6)((ulong)pSVar2 >> 0x10);
        local_138.enum_def._0_2_ = SUB82(pEVar4,0);
        local_138.enum_def._2_6_ = (undefined6)((ulong)pEVar4 >> 0x10);
LAB_001b176a:
        NumToString<unsigned_long>(&local_158,local_70);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x36d984);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        psVar10 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_110.field_2._M_allocated_capacity = *psVar10;
          local_110.field_2._8_8_ = plVar7[3];
        }
        else {
          local_110.field_2._M_allocated_capacity = *psVar10;
          local_110._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_110._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((local_80->type).base_type == BASE_TYPE_ARRAY) {
          local_c8 = &local_b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,local_a8,local_a0 + (long)local_a8);
          std::__cxx11::string::append((char *)&local_c8);
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_c8,(ulong)local_110._M_dataplus._M_p);
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_f0.field_2._M_allocated_capacity = *psVar10;
            local_f0.field_2._8_8_ = plVar7[3];
            local_f0._M_dataplus._M_p = (pointer)paVar11;
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar10;
            local_f0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_f0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_158.field_2._M_allocated_capacity = *psVar10;
            local_158.field_2._8_8_ = plVar7[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar10;
            local_158._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_158._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_158._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != paVar11) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if (local_c8 != &local_b8) {
            operator_delete(local_c8,local_b8 + 1);
          }
          NumToString<unsigned_short>(&local_158,(field->value).type.fixed_length);
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_158._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_60,"; ",&local_110);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
          local_c8 = &local_b8;
          plVar9 = plVar7 + 2;
          if ((long *)*plVar7 == plVar9) {
            local_b8 = *plVar9;
            lStack_b0 = plVar7[3];
          }
          else {
            local_b8 = *plVar9;
            local_c8 = (long *)*plVar7;
          }
          local_c0 = plVar7[1];
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_c8,(ulong)local_110._M_dataplus._M_p);
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_f0.field_2._M_allocated_capacity = *psVar10;
            local_f0.field_2._8_8_ = plVar7[3];
            local_f0._M_dataplus._M_p = (pointer)paVar11;
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar10;
            local_f0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_f0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_158.field_2._M_allocated_capacity = *psVar10;
            local_158.field_2._8_8_ = plVar7[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar10;
            local_158._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_158._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_158._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != paVar11) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if (local_c8 != &local_b8) {
            operator_delete(local_c8,local_b8 + 1);
          }
          paVar8 = &local_60.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != paVar8) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            paVar8 = extraout_RAX;
          }
          local_cc = (uint)CONCAT71((int7)((ulong)paVar8 >> 8),1);
        }
        if ((local_138.base_type == BASE_TYPE_STRUCT) &&
           (*(char *)(CONCAT62(local_138.struct_def._2_6_,local_138.struct_def._0_2_) + 0x110) ==
            '\x01')) {
          pSVar2 = (field->value).type.struct_def;
          pcVar3 = (field->super_Definition).name._M_dataplus._M_p;
          local_f0._M_dataplus._M_p = (pointer)paVar11;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,pcVar3,
                     pcVar3 + (field->super_Definition).name._M_string_length);
          std::__cxx11::string::append((char *)&local_f0);
          pcVar6 = local_68;
          strlen(local_68);
          plVar7 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_f0,0,(char *)0x0,(ulong)pcVar6);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_158.field_2._M_allocated_capacity = *psVar10;
            local_158.field_2._8_8_ = plVar7[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar10;
            local_158._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_158._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          GenStructBody(local_88,pSVar2,code_ptr,local_158._M_dataplus._M_p,local_40,
                        (bool)((byte)local_cc & 1));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::append((char *)code_ptr);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,local_a8,local_a0 + (long)local_a8);
          std::__cxx11::string::append((char *)&local_158);
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_158._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          GenMethod_abi_cxx11_(&local_f0,local_88,&local_138);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_158.field_2._M_allocated_capacity = *psVar10;
            local_158.field_2._8_8_ = plVar7[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar10;
            local_158._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_158._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_158._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != paVar11) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          SourceCast_abi_cxx11_(&local_158,local_88,&local_138,false);
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_158._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          Name_abi_cxx11_(&local_f0,local_88,field);
          pcVar6 = local_68;
          strlen(local_68);
          plVar7 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_f0,0,(char *)0x0,(ulong)pcVar6);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_158.field_2._M_allocated_capacity = *psVar10;
            local_158.field_2._8_8_ = plVar7[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar10;
            local_158._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_158._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != paVar11) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_158._M_dataplus._M_p);
          uVar14 = ((local_80->type).base_type == BASE_TYPE_ARRAY) + local_70;
          if (uVar14 != 0) {
            std::__cxx11::string::append((char *)code_ptr);
            if ((local_cc & 1) != 0) {
              t = 0;
              do {
                NumToString<unsigned_long>(&local_60,t);
                plVar7 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_60,0,(char *)0x0,0x36d984);
                local_c8 = &local_b8;
                plVar9 = plVar7 + 2;
                if ((long *)*plVar7 == plVar9) {
                  local_b8 = *plVar9;
                  lStack_b0 = plVar7[3];
                }
                else {
                  local_b8 = *plVar9;
                  local_c8 = (long *)*plVar7;
                }
                local_c0 = plVar7[1];
                *plVar7 = (long)plVar9;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
                psVar10 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar10) {
                  local_f0.field_2._M_allocated_capacity = *psVar10;
                  local_f0.field_2._8_8_ = plVar7[3];
                  local_f0._M_dataplus._M_p = (pointer)paVar11;
                }
                else {
                  local_f0.field_2._M_allocated_capacity = *psVar10;
                  local_f0._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_f0._M_string_length = plVar7[1];
                *plVar7 = (long)psVar10;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != paVar11) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                if (local_c8 != &local_b8) {
                  operator_delete(local_c8,local_b8 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_60._M_dataplus._M_p != &local_60.field_2) {
                  operator_delete(local_60._M_dataplus._M_p,
                                  local_60.field_2._M_allocated_capacity + 1);
                }
                if (uVar14 - 1 != t) {
                  std::__cxx11::string::append((char *)code_ptr);
                }
                t = t + 1;
              } while (t < uVar14);
            }
            std::__cxx11::string::append((char *)code_ptr);
          }
          std::__cxx11::string::append((char *)code_ptr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
        }
        if ((local_80->type).base_type == BASE_TYPE_ARRAY) {
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,local_a8,local_a0 + (long)local_a8);
          std::__cxx11::string::append((char *)&local_158);
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_158._M_dataplus._M_p);
          uVar12 = local_158.field_2._M_allocated_capacity;
          _Var13._M_p = local_158._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) goto LAB_001b20ca;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      ppFVar15 = local_38 + -1;
    } while (ppFVar15 !=
             (local_78->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  return;
}

Assistant:

void GenStructBody(const StructDef &struct_def, std::string *code_ptr,
                     const char *nameprefix, size_t index = 0,
                     bool in_array = false) const {
    std::string &code = *code_ptr;
    std::string indent((index + 1) * 2, ' ');
    code += indent + "  builder.Prep(";
    code += NumToString(struct_def.minalign) + ", ";
    code += NumToString(struct_def.bytesize) + ");\n";
    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      if (field.padding) {
        code += indent + "  builder.Pad(";
        code += NumToString(field.padding) + ");\n";
      }
      if (IsStruct(field_type)) {
        GenStructBody(*field_type.struct_def, code_ptr,
                      (nameprefix + (field.name + "_")).c_str(), index,
                      in_array);
      } else {
        const auto &type =
            IsArray(field_type) ? field_type.VectorType() : field_type;
        const auto index_var = "_idx" + NumToString(index);
        if (IsArray(field_type)) {
          code += indent + "  for (int " + index_var + " = ";
          code += NumToString(field_type.fixed_length);
          code += "; " + index_var + " > 0; " + index_var + "--) {\n";
          in_array = true;
        }
        if (IsStruct(type)) {
          GenStructBody(*field_type.struct_def, code_ptr,
                        (nameprefix + (field.name + "_")).c_str(), index + 1,
                        in_array);
        } else {
          code += IsArray(field_type) ? "  " : "";
          code += indent + "  builder.Put";
          code += GenMethod(type) + "(";
          code += SourceCast(type);
          auto argname = nameprefix + Name(field);
          code += argname;
          size_t array_cnt = index + (IsArray(field_type) ? 1 : 0);
          if (array_cnt > 0) {
            code += "[";
            for (size_t i = 0; in_array && i < array_cnt; i++) {
              code += "_idx" + NumToString(i) + "-1";
              if (i != (array_cnt - 1)) code += ",";
            }
            code += "]";
          }
          code += ");\n";
        }
        if (IsArray(field_type)) { code += indent + "  }\n"; }
      }
    }
  }